

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontInfo.cpp
# Opt level: O2

string * __thiscall
FontInfo::getCharSetName_abi_cxx11_(string *__return_storage_ptr__,FontInfo *this,uint8_t charSet)

{
  uint uVar1;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (uint)this;
  switch(uVar1) {
  case 0x80:
    break;
  case 0x81:
    break;
  case 0x82:
    break;
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x87:
switchD_0015b18b_caseD_83:
    std::__cxx11::to_string(&local_30,uVar1 & 0xff);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  case 0x86:
    break;
  case 0x88:
    break;
  default:
    if (((((uVar1 != 0xff) && (uVar1 != 1)) && (uVar1 != 2)) &&
        ((((uVar1 != 0x4d && (uVar1 != 0xa1)) &&
          ((uVar1 != 0xa2 && ((uVar1 != 0xa3 && (uVar1 != 0xb1)))))) && (uVar1 != 0xb2)))) &&
       ((((uVar1 != 0xba && (uVar1 != 0xcc)) && (uVar1 != 0xde)) &&
        ((uVar1 != 0xee && (uVar1 != 0)))))) goto switchD_0015b18b_caseD_83;
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string FontInfo::getCharSetName(std::uint8_t charSet)
{
    std::string str;

    switch(charSet)
    {
        case 0: // ANSI_CHARSET
            str = "ANSI";
            break;
        case 1: // DEFAULT_CHARSET
            str = "DEFAULT";
            break;
        case 2: // SYMBOL_CHARSET
            str = "SYMBOL";
            break;
        case 128: // SHIFTJIS_CHARSET
            str = "SHIFTJIS";
            break;
        case 129: // HANGUL_CHARSET
            str = "HANGUL";
            break;
        case 134: // GB2312_CHARSET
            str = "GB2312";
            break;
        case 136: // CHINESEBIG5_CHARSET
            str = "CHINESEBIG5";
            break;
        case 255: // OEM_CHARSET
            str = "OEM";
            break;
        case 130: // JOHAB_CHARSET
            str = "JOHAB";
            break;
        case 177: // HEBREW_CHARSET
            str = "HEBREW";
            break;
        case 178: // ARABIC_CHARSET
            str = "ARABIC";
            break;
        case 161: // GREEK_CHARSET
            str = "GREEK";
            break;
        case 162: // TURKISH_CHARSET
            str = "TURKISH";
            break;
        case 163: // VIETNAMESE_CHARSET
            str = "VIETNAMESE";
            break;
        case 222: // THAI_CHARSET
            str = "THAI";
            break;
        case 238: // EASTEUROPE_CHARSET
            str = "EASTEUROPE";
            break;
        case 204: // RUSSIAN_CHARSET
            str = "RUSSIAN";
            break;
        case 77:  // MAC_CHARSET
            str = "MAC";
            break;
        case 186: // BALTIC_CHARSET
            str = "BALTIC";
            break;

        default:
            str = std::to_string(charSet);
    }

    return str;
}